

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O0

void __thiscall tonk::BandwidthEstimator::OnInterval(BandwidthEstimator *this,uint intervalUsec)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  uint in_ESI;
  undefined8 *in_RDI;
  uint maxTripUsec;
  uint minTripUsec;
  float plr;
  int lossCount;
  int expected;
  uint receiveBPS;
  uint64_t scaledBytes;
  undefined4 local_44;
  Counter<unsigned_int,_32U> local_34;
  int local_30;
  int local_2c;
  float fVar4;
  
  *in_RDI = in_RDI[0xd];
  if (in_ESI == 0) {
    local_44 = 0;
  }
  else {
    local_44 = (undefined4)(((ulong)*(uint *)(in_RDI + 0xf) * 1000000) / (ulong)in_ESI);
  }
  *(undefined4 *)((long)in_RDI + 0xc) = local_44;
  iVar2 = (int)in_RDI[0xb] - (int)in_RDI[6];
  iVar3 = iVar2 - *(int *)((long)in_RDI + 0x7c);
  fVar4 = 0.0;
  if ((0 < iVar2) && (0 < iVar3)) {
    auVar1 = vcvtusi2ss_avx512f((undefined1  [16])0x0,iVar3);
    fVar4 = auVar1._0_4_ / (float)iVar2;
  }
  auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40e00000),0),ZEXT416(*(uint *)(in_RDI + 3)),
                           ZEXT416((uint)fVar4));
  *(float *)(in_RDI + 3) = auVar1._0_4_ / 8.0;
  if (*(int *)(in_RDI + 1) == 0) {
    *(undefined4 *)(in_RDI + 1) = *(undefined4 *)((long)in_RDI + 0xc);
  }
  else {
    *(uint *)(in_RDI + 1) = (uint)(*(int *)(in_RDI + 1) * 7 + *(int *)((long)in_RDI + 0xc)) >> 3;
  }
  local_2c = *(int *)(in_RDI + 0xc);
  if (*(int *)((long)in_RDI + 0x14) == 0) {
    *(int *)((long)in_RDI + 0x14) = local_2c;
  }
  else {
    *(uint *)((long)in_RDI + 0x14) = (uint)(*(int *)((long)in_RDI + 0x14) * 7 + local_2c) >> 3;
  }
  local_30 = *(int *)(in_RDI + 0x10);
  if (*(int *)(in_RDI + 2) == 0) {
    *(int *)(in_RDI + 2) = local_30;
  }
  else {
    *(uint *)(in_RDI + 2) = (uint)(*(int *)(in_RDI + 2) * 7 + local_30) >> 3;
  }
  Counter<unsigned_int,_32U>::Counter(&local_34,(ThisType *)((long)in_RDI + 0x74));
  Counter<unsigned_int,_32U>::operator=
            ((Counter<unsigned_int,_32U> *)((long)in_RDI + 0x1c),&local_34);
  InterPacketGapEstimator::OnIntervalEnd((InterPacketGapEstimator *)(in_RDI + 4));
  DatagramInfo::operator=
            ((DatagramInfo *)CONCAT44(local_44,iVar2),(DatagramInfo *)CONCAT44(iVar3,fVar4));
  *(undefined4 *)(in_RDI + 0xf) = 0;
  *(undefined4 *)((long)in_RDI + 0x7c) = 0;
  return;
}

Assistant:

void BandwidthEstimator::OnInterval(const unsigned intervalUsec)
{
    // Record timestamp for the burst
    Measurement.TimestampUsec = Previous.ReceiveUsec;

    {
        // Calculate receive BPS
        const uint64_t scaledBytes = (uint64_t)IntervalDatagramBytes * 1000000ULL;
        const unsigned receiveBPS = intervalUsec > 0 ? (unsigned)(scaledBytes / intervalUsec) : 0;
        Measurement.LatestProbeBPS = receiveBPS;
    }

    // Calculate send BPS
    //const Counter24 sendIntervalTS24 = Previous.SendTS24 - Start.SendTS24;
    //const unsigned sendIntervalUsec = sendIntervalTS24.ToUnsigned() << kTime23LostBits;
    //Measurement.LatestGoodputBPS = sendIntervalUsec > 0 ? (unsigned)(scaledBytes / sendIntervalUsec) : 0;

    // Calculate PLR
    const int expected = (int)(int64_t)(Previous.Nonce - Start.Nonce);
    const int lossCount = expected - (int)IntervalInSeqCount;
    TONK_DEBUG_ASSERT(lossCount >= 0);

    float plr = 0.f;
    if (expected > 0 && lossCount > 0) {
        plr = (unsigned)lossCount / (float)expected;
    }

    // Smooth the received PLR using EWMA
    Measurement.SmoothedPLR = (Measurement.SmoothedPLR * 7.f + plr) / 8.f;

    // Smooth the received BPS using EWMA
    if (Measurement.SmoothedGoodputBPS == 0) {
        Measurement.SmoothedGoodputBPS = Measurement.LatestProbeBPS;
    }
    else {
        Measurement.SmoothedGoodputBPS = (Measurement.SmoothedGoodputBPS * 7 + Measurement.LatestProbeBPS) / 8;
    }

    // Smooth the minimum trip time estimate
    const unsigned minTripUsec = Previous.NetworkTripUsec;
    if (Measurement.SmoothedMinTripUsec == 0) {
        Measurement.SmoothedMinTripUsec = minTripUsec;
    }
    else {
        Measurement.SmoothedMinTripUsec = (Measurement.SmoothedMinTripUsec * 7 + minTripUsec) / 8;
    }

    // Smooth the maximum trip time estimate
    const unsigned maxTripUsec = IntervalMaxTripUsec;
    if (Measurement.SmoothedMaxTripUsec == 0) {
        Measurement.SmoothedMaxTripUsec = maxTripUsec;
    }
    else {
        Measurement.SmoothedMaxTripUsec = (Measurement.SmoothedMaxTripUsec * 7 + maxTripUsec) / 8;
    }

    // Record the smallest ReceiveSendDeltaTS24
    Measurement.MinReceiveSendDeltaTS24 = Previous.ReceiveSendDeltaTS24;

    // Update statistics
    InterPacketGap.OnIntervalEnd();

    TONK_VERBOSE_BANDWIDTH_LOG(
        "ProbeBPS=", Measurement.LatestProbeBPS,
        " Goodput=", Measurement.SmoothedGoodputBPS,
        " MinTrip=", Previous.NetworkTripUsec,
        " Interval=", intervalUsec,
        " Bytes=", IntervalDatagramBytes,
        " Count=", IntervalInSeqCount,
        " PLR=", Measurement.SmoothedPLR,
        " AvgMin=", Measurement.SmoothedMinTripUsec,
        " AvgMax=", Measurement.SmoothedMaxTripUsec,
        " IPG=", InterPacketGap.Get());

    // Reset interval sampling
    Start = Previous;
    IntervalDatagramBytes = 0;
    IntervalInSeqCount = 0;
}